

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void Json::appendHex(String *result,uint ch)

{
  undefined1 uVar1;
  string *psVar2;
  ulong uVar3;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  psVar2 = (string *)std::__cxx11::string::append((char *)result);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,'\x04');
  uVar3 = (ulong)(ch >> 8 & 0xff);
  uVar1 = hex2[uVar3 * 2 + 1];
  *local_38[0] = hex2[uVar3 * 2];
  local_38[0][1] = uVar1;
  uVar1 = hex2[(ulong)(ch & 0xff) * 2 + 1];
  local_38[0][2] = hex2[(ulong)(ch & 0xff) * 2];
  local_38[0][3] = uVar1;
  std::__cxx11::string::append(psVar2);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void appendHex(String& result, unsigned ch) {
  result.append("\\u").append(toHex16Bit(ch));
}